

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::ChimpScanState<float>::LoadGroup(ChimpScanState<float> *this,CHIMP_TYPE *value_buffer)

{
  byte bVar1;
  unsigned_short uVar2;
  unsigned_long uVar3;
  ChimpGroupState<unsigned_int> *this_00;
  uint *result;
  ChimpGroupState<unsigned_int> *in_RDI;
  idx_t packed_data_block_count;
  data_ptr_t flags;
  uint16_t flag_byte_count;
  unsigned_long flag_count;
  unsigned_long group_size;
  data_ptr_t leading_zero_block_ptr;
  uchar leading_zero_block_count;
  uint data_byte_offset;
  ChimpGroupState<unsigned_int> *this_01;
  undefined6 in_stack_ffffffffffffffc8;
  ushort uVar4;
  
  *(long *)(in_RDI->flags + 0x18) = *(long *)(in_RDI->flags + 0x18) + -4;
  Load<unsigned_int>(*(const_data_ptr_t *)(in_RDI->flags + 0x18));
  *(long *)(in_RDI->flags + 0x18) = *(long *)(in_RDI->flags + 0x18) + -1;
  bVar1 = Load<unsigned_char>(*(const_data_ptr_t *)(in_RDI->flags + 0x18));
  *(ulong *)(in_RDI->flags + 0x18) = *(long *)(in_RDI->flags + 0x18) + (ulong)bVar1 * -3;
  uVar3 = MinValue<unsigned_long>
                    (*(long *)(in_RDI[1].flags + 0x30) - *(long *)(in_RDI->flags + 0x20),0x400);
  this_00 = (ChimpGroupState<unsigned_int> *)(uVar3 - 1);
  uVar2 = UnsafeNumericCast<unsigned_short,unsigned_long,void>((unsigned_long)this_00);
  uVar2 = AlignValue<unsigned_short,_(unsigned_short)4>(uVar2);
  uVar4 = uVar2 / 4;
  *(long *)(in_RDI->flags + 0x18) = *(long *)(in_RDI->flags + 0x18) - (long)(int)(uint)uVar4;
  this_01 = *(ChimpGroupState<unsigned_int> **)(in_RDI->flags + 0x18);
  ChimpGroupState<unsigned_int>::LoadFlags
            (this_00,(uint8_t *)CONCAT26(uVar4,in_stack_ffffffffffffffc8),(idx_t)this_01);
  ChimpGroupState<unsigned_int>::LoadLeadingZeros
            (this_00,(uint8_t *)CONCAT26(uVar4,in_stack_ffffffffffffffc8),(idx_t)this_01);
  result = (uint *)ChimpGroupState<unsigned_int>::CalculatePackedDataCount
                             ((ChimpGroupState<unsigned_int> *)(in_RDI->flags + 0x28));
  *(long *)(in_RDI->flags + 0x18) = *(long *)(in_RDI->flags + 0x18) + (long)result * -2;
  if ((*(ulong *)(in_RDI->flags + 0x18) & 1) != 0) {
    *(long *)(in_RDI->flags + 0x18) = *(long *)(in_RDI->flags + 0x18) + -1;
  }
  ChimpGroupState<unsigned_int>::LoadPackedData(this_01,(uint16_t *)result,(idx_t)in_RDI);
  ChimpGroupState<unsigned_int>::Reset(in_RDI);
  ChimpGroupState<unsigned_int>::LoadValues(this_01,result,(idx_t)in_RDI);
  return;
}

Assistant:

void LoadGroup(CHIMP_TYPE *value_buffer) {

		//! FIXME: If we change the order of this to flag -> leading_zero_blocks -> packed_data
		//! We can leave out the leading zero block count as well, because it can be derived from
		//! Extracting all the flags and counting the 3's

		// Load the offset indicating where a groups data starts
		metadata_ptr -= sizeof(uint32_t);
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());
		//  Only used for point queries
		(void)data_byte_offset;

		// Load how many blocks of leading zero bits we have
		metadata_ptr -= sizeof(uint8_t);
		auto leading_zero_block_count = Load<uint8_t>(metadata_ptr);
		D_ASSERT(leading_zero_block_count <= ChimpPrimitives::CHIMP_SEQUENCE_SIZE / 8);

		// Load the leading zero block count
		metadata_ptr -= 3ULL * leading_zero_block_count;
		const auto leading_zero_block_ptr = metadata_ptr;

		// Figure out how many flags there are
		D_ASSERT(segment_count >= total_value_count);
		auto group_size = MinValue<idx_t>(segment_count - total_value_count, ChimpPrimitives::CHIMP_SEQUENCE_SIZE);
		// Reduce by one, because the first value of a group does not have a flag
		auto flag_count = group_size - 1;
		uint16_t flag_byte_count = AlignValue<uint16_t, 4>(UnsafeNumericCast<uint16_t>(flag_count)) / 4;

		// Load the flags
		metadata_ptr -= flag_byte_count;
		auto flags = metadata_ptr;
		group_state.LoadFlags(flags, flag_count);

		// Load the leading zero blocks
		group_state.LoadLeadingZeros(leading_zero_block_ptr, (uint32_t)leading_zero_block_count * 8);

		// Load packed data blocks
		auto packed_data_block_count = group_state.CalculatePackedDataCount();
		metadata_ptr -= packed_data_block_count * 2;
		if ((uint64_t)metadata_ptr & 1) {
			// Align on a two-byte boundary
			metadata_ptr--;
		}
		group_state.LoadPackedData((uint16_t *)metadata_ptr, packed_data_block_count);

		group_state.Reset();

		// Load all values for the group
		group_state.LoadValues(value_buffer, group_size);
	}